

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

LY_ERR lyb_read_string(char **str,uint8_t len_size,lylyb_ctx *lybctx)

{
  char *pcVar1;
  size_t local_30;
  uint64_t len;
  lylyb_ctx *lybctx_local;
  char **ppcStack_18;
  uint8_t len_size_local;
  char **str_local;
  
  local_30 = 0;
  len = (uint64_t)lybctx;
  lybctx_local._7_1_ = len_size;
  ppcStack_18 = str;
  if ((((len_size != '\x01') && (len_size != '\x02')) && (len_size != '\x04')) && (len_size != '\b')
     ) {
    __assert_fail("(len_size == 1) || (len_size == 2) || (len_size == 4) || (len_size == 8)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                  ,0xd6,"LY_ERR lyb_read_string(char **, uint8_t, struct lylyb_ctx *)");
  }
  *str = (char *)0x0;
  lyb_read_number(&local_30,8,(ulong)len_size,lybctx);
  pcVar1 = (char *)malloc(local_30 + 1);
  *ppcStack_18 = pcVar1;
  pcVar1 = *ppcStack_18;
  if (pcVar1 != (char *)0x0) {
    lyb_read((uint8_t *)*ppcStack_18,local_30,(lylyb_ctx *)len);
    (*ppcStack_18)[local_30] = '\0';
  }
  else {
    ly_log(*(ly_ctx **)len,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyb_read_string");
  }
  str_local._4_4_ = (LY_ERR)(pcVar1 == (char *)0x0);
  return str_local._4_4_;
}

Assistant:

static LY_ERR
lyb_read_string(char **str, uint8_t len_size, struct lylyb_ctx *lybctx)
{
    uint64_t len = 0;

    assert((len_size == 1) || (len_size == 2) || (len_size == 4) || (len_size == 8));

    *str = NULL;

    lyb_read_number(&len, sizeof len, len_size, lybctx);

    *str = malloc((len + 1) * sizeof **str);
    LY_CHECK_ERR_RET(!*str, LOGMEM(lybctx->ctx), LY_EMEM);

    lyb_read((uint8_t *)*str, len, lybctx);

    (*str)[len] = '\0';
    return LY_SUCCESS;
}